

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.h
# Opt level: O0

void __thiscall
MinVR::VRParseCommandLine::help
          (VRParseCommandLine *this,VRSearchConfig *configPath,string *additionalText)

{
  ostream *this_00;
  string *in_RDX;
  string *in_stack_00000608;
  VRSearchConfig *in_stack_00000610;
  VRParseCommandLine *in_stack_00000618;
  string local_58 [32];
  string local_38 [56];
  
  std::__cxx11::string::string(local_58,in_RDX);
  makeHelpString(in_stack_00000618,in_stack_00000610,in_stack_00000608);
  this_00 = std::operator<<((ostream *)&std::cerr,local_38);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void help(VRSearchConfig &configPath, const std::string additionalText = "") {
    std::cerr << makeHelpString(configPath, additionalText) << std::endl;
  }